

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Any.H
# Opt level: O0

void __thiscall amrex::Any::operator=(Any *this,MultiFab *mf)

{
  unique_ptr<amrex::Any::innards_base,_std::default_delete<amrex::Any::innards_base>_> *in_RSI;
  MultiFab *in_RDI;
  unique_ptr<amrex::Any::innards<amrex::MultiFab>,_std::default_delete<amrex::Any::innards<amrex::MultiFab>_>_>
  *in_stack_ffffffffffffffe8;
  
  std::make_unique<amrex::Any::innards<amrex::MultiFab>,amrex::MultiFab>(in_RDI);
  std::unique_ptr<amrex::Any::innards_base,std::default_delete<amrex::Any::innards_base>>::operator=
            (in_RSI,in_stack_ffffffffffffffe8);
  std::
  unique_ptr<amrex::Any::innards<amrex::MultiFab>,_std::default_delete<amrex::Any::innards<amrex::MultiFab>_>_>
  ::~unique_ptr((unique_ptr<amrex::Any::innards<amrex::MultiFab>,_std::default_delete<amrex::Any::innards<amrex::MultiFab>_>_>
                 *)in_RDI);
  return;
}

Assistant:

void operator= (MF && mf) {
        m_ptr = std::make_unique<innards<MF> >(std::forward<MF>(mf));
    }